

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_history.c
# Opt level: O2

void fsg_history_utt_start(fsg_history_t *h)

{
  glist_t *ppgVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (h->entries->n_valid != 0) {
    __assert_fail("blkarray_list_n_valid(h->entries) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_history.c"
                  ,0x10a,"void fsg_history_utt_start(fsg_history_t *)");
  }
  if (h->frame_entries != (glist_t **)0x0) {
    uVar4 = 0;
    uVar3 = (ulong)(uint)h->n_ciphone;
    if (h->n_ciphone < 1) {
      uVar3 = uVar4;
    }
    uVar2 = h->fsg->n_state;
    uVar5 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar5 = uVar4;
    }
    do {
      if (uVar4 == uVar5) {
        return;
      }
      uVar6 = 0;
      while (uVar3 != uVar6) {
        ppgVar1 = h->frame_entries[uVar4] + uVar6;
        uVar6 = uVar6 + 1;
        if (*ppgVar1 != (glist_t)0x0) {
          __assert_fail("h->frame_entries[s][lc] == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_history.c"
                        ,0x112,"void fsg_history_utt_start(fsg_history_t *)");
        }
      }
      uVar4 = uVar4 + 1;
    } while( true );
  }
  __assert_fail("h->frame_entries",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_history.c"
                ,0x10b,"void fsg_history_utt_start(fsg_history_t *)");
}

Assistant:

void
fsg_history_utt_start(fsg_history_t * h)
{
    int32 s, lc, ns, np;

    assert(blkarray_list_n_valid(h->entries) == 0);
    assert(h->frame_entries);

    ns = fsg_model_n_state(h->fsg);
    np = h->n_ciphone;

    for (s = 0; s < ns; s++) {
        for (lc = 0; lc < np; lc++) {
            assert(h->frame_entries[s][lc] == NULL);
        }
    }
}